

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O2

void * Js::JavascriptExceptionOperators::OP_TryCatch
                 (void *tryAddr,void *catchAddr,void *frame,size_t spillSize,size_t argsSize,
                 int hasBailedOutOffset,ScriptContext *scriptContext)

{
  void *pvVar1;
  undefined1 local_80 [8];
  HasBailedOutPtrStack hasBailedOutPtrStack;
  TryHandlerAddrOfReturnAddrStack tryHandlerAddrOfReturnAddrStack;
  AutoCatchHandlerExists autoCatchHandlerExists;
  
  HasBailedOutPtrStack::HasBailedOutPtrStack
            ((HasBailedOutPtrStack *)local_80,scriptContext,
             (bool *)((long)hasBailedOutOffset + (long)frame));
  ThreadContext::ProbeStack
            (scriptContext->threadContext,spillSize + argsSize + 0x4c00,scriptContext,(PVOID)0x0);
  TryHandlerAddrOfReturnAddrStack::TryHandlerAddrOfReturnAddrStack
            ((TryHandlerAddrOfReturnAddrStack *)&hasBailedOutPtrStack.m_threadContext,scriptContext,
             (void *)((long)frame + 8));
  AutoCatchHandlerExists::AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)&tryHandlerAddrOfReturnAddrStack.m_threadContext,
             scriptContext,true);
  pvVar1 = (void *)amd64_CallWithFakeFrame(tryAddr,frame,spillSize,argsSize,0);
  AutoCatchHandlerExists::~AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)&tryHandlerAddrOfReturnAddrStack.m_threadContext);
  TryHandlerAddrOfReturnAddrStack::~TryHandlerAddrOfReturnAddrStack
            ((TryHandlerAddrOfReturnAddrStack *)&hasBailedOutPtrStack.m_threadContext);
  HasBailedOutPtrStack::~HasBailedOutPtrStack((HasBailedOutPtrStack *)local_80);
  return pvVar1;
}

Assistant:

void *JavascriptExceptionOperators::OP_TryCatch(void          *tryAddr,
                                                    void          *catchAddr,
                                                    void          *frame,
                                                    size_t         spillSize,
                                                    size_t         argsSize,
                                                    int            hasBailedOutOffset,
                                                    ScriptContext *scriptContext)
    {
        void *continuation = nullptr;
        JavascriptExceptionObject *exception = nullptr;
        void *tryHandlerAddrOfReturnAddr = nullptr;

        Js::JavascriptExceptionOperators::HasBailedOutPtrStack hasBailedOutPtrStack(scriptContext, (bool*)((char*)frame + hasBailedOutOffset));

        PROBE_STACK(scriptContext, Constants::MinStackJitEHBailout + spillSize + argsSize);
        {
            void * addrOfReturnAddr = (void*)((char*)frame + sizeof(char*));
            Js::JavascriptExceptionOperators::TryHandlerAddrOfReturnAddrStack tryHandlerAddrOfReturnAddrStack(scriptContext, addrOfReturnAddr);
            try
            {
                Js::JavascriptExceptionOperators::AutoCatchHandlerExists autoCatchHandlerExists(scriptContext);
                continuation = amd64_CallWithFakeFrame(tryAddr, frame, spillSize, argsSize);
            }
            catch (const Js::JavascriptException& err)
            {
                exception = err.GetAndClear();
                tryHandlerAddrOfReturnAddr = scriptContext->GetThreadContext()->GetTryHandlerAddrOfReturnAddr();
            }
        }
        if (exception)
        {
            // We need to clear callinfo on inlinee virtual frames on an exception.
            // We now allow inlining of functions into callers that have try-catch/try-finally.
            // When there is an exception inside the inlinee with caller having a try-catch, clear the inlinee callinfo by walking the stack.
            // If not, we might have the try-catch inside a loop, and when we execute the loop next time in the interpreter on BailOnException,
            // we will see inlined frames as being present even though they are not, because we depend on FrameInfo's callinfo to tell if an inlinee is on the stack,
            // and we haven't cleared those bits due to the exception
            // When we start inlining functions with try, we have to track the try addresses of the inlined functions as well.

#if ENABLE_NATIVE_CODEGEN
            if (exception->GetExceptionContext() && exception->GetExceptionContext()->ThrowingFunction())
            {
                WalkStackForCleaningUpInlineeInfo(scriptContext, nullptr /* start stackwalk from the current frame */, tryHandlerAddrOfReturnAddr);
            }
#endif

            exception = exception->CloneIfStaticExceptionObject(scriptContext);
            bool hasBailedOut = *(bool*)((char*)frame + hasBailedOutOffset); // stack offsets are negative
            // If an inlinee bailed out due to some reason, the execution of the current function enclosing the try catch will also continue in the interpreter
            // During execution in the interpreter, if we throw outside the region enclosed in try/catch, this catch ends up catching that exception because its present on the call stack
            if (hasBailedOut)
            {
                // If we have bailed out, this exception is coming from the interpreter. It should not have been caught;
                // it so happens that this catch was on the stack and caught the exception.
                // Re-throw!
                JavascriptExceptionOperators::DoThrow(exception, scriptContext);
            }

            Var exceptionObject = exception->GetThrownObject(scriptContext);
            AssertMsg(exceptionObject, "Caught object is null.");
            continuation = amd64_CallWithFakeFrame(catchAddr, frame, spillSize, argsSize, exceptionObject);
        }
        return continuation;
    }